

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O1

bool deqp::gles3::Accuracy::isValidFloat(Precision precision,float val)

{
  Float<unsigned_short,_5,_10,_15,_3U> FVar1;
  bool bVar2;
  Float<unsigned_int,_8,_23,_127,_3U> local_4;
  
  if (precision == PRECISION_MEDIUMP) {
    FVar1 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>(&local_4);
    bVar2 = (FVar1.m_value & 0x3ff) == 0;
    return ((FVar1.m_value & 0x7c00) != 0x7c00 || bVar2) &&
           ((FVar1.m_value & 0x7fff) != 0x7c00 && ((FVar1.m_value & 0x7c00) != 0 || bVar2));
  }
  return (((uint)val & 0x7f800000) != 0x7f800000 && ((uint)val & 0x7f800000) != 0 ||
         ((uint)val & 0x7fffff) == 0) && ABS(val) != INFINITY;
}

Assistant:

static bool isValidFloat (glu::Precision precision, float val)
{
	if (precision == glu::PRECISION_MEDIUMP)
	{
		tcu::Float16 fp16(val);
		return !fp16.isDenorm() && !fp16.isInf() && !fp16.isNaN();
	}
	else
	{
		tcu::Float32 fp32(val);
		return !fp32.isDenorm() && !fp32.isInf() && !fp32.isNaN();
	}
}